

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O0

Var Js::HelperMethodWrapper3
              (ScriptContext *scriptContext,void *origHelperAddr,Var arg1,Var arg2,Var arg3)

{
  code *pcVar1;
  anon_class_32_4_c47c058d fn;
  bool bVar2;
  undefined4 *puVar3;
  Var pvVar4;
  Var arg3_local;
  Var arg2_local;
  Var arg1_local;
  void *origHelperAddr_local;
  ScriptContext *scriptContext_local;
  
  if (origHelperAddr == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0x62,"(origHelperAddr)","origHelperAddr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  fn.arg1 = arg1;
  fn.origHelperAddr = origHelperAddr;
  fn.arg2 = arg2;
  fn.arg3 = arg3;
  pvVar4 = HelperMethodWrapper<Js::HelperMethodWrapper3(Js::ScriptContext*,void*,void*,void*,void*)::__0>
                     (scriptContext,fn);
  return pvVar4;
}

Assistant:

Var HelperMethodWrapper3(ScriptContext* scriptContext, void* origHelperAddr, Var arg1, Var arg2, Var arg3)
    {
        Assert(origHelperAddr);
        return HelperMethodWrapper(scriptContext, [=] {
            return ((OrigHelperMethod3)origHelperAddr)(arg1, arg2, arg3);
        });
    }